

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::SingleArena_CopyConstructValueWithDefault_Test::TestBody
          (SingleArena_CopyConstructValueWithDefault_Test *this)

{
  bool bVar1;
  pointer arena_00;
  string *lhs;
  char *message;
  AssertHelper local_a0;
  Message local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar;
  ArenaStringPtr dst;
  LazyString default_value;
  ArenaStringPtr field;
  undefined1 local_38 [8];
  unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_> arena;
  string empty;
  SingleArena_CopyConstructValueWithDefault_Test *this_local;
  
  std::__cxx11::string::string((string *)&arena);
  SingleArena::GetArena((SingleArena *)local_38);
  internal::ArenaStringPtr::InitExternal((ArenaStringPtr *)&default_value.inited_,(string *)&arena);
  internal::ArenaStringPtr::Set((ArenaStringPtr *)&default_value.inited_,"Hello world",(Arena *)0x0)
  ;
  default_value.field_0._24_8_ = 0;
  default_value.field_0.init_value_.size = 0;
  default_value.field_0._16_8_ = 0;
  dst.tagged_ptr_.ptr_ = (TaggedStringPtr)anon_var_dwarf_a7e2b;
  default_value.field_0.init_value_.ptr = (char *)0xd;
  arena_00 = std::unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>
             ::get((unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>
                    *)local_38);
  internal::ArenaStringPtr::ArenaStringPtr
            ((ArenaStringPtr *)&gtest_ar.message_,arena_00,(ArenaStringPtr *)&default_value.inited_,
             (LazyString *)&dst);
  lhs = internal::ArenaStringPtr::Get_abi_cxx11_((ArenaStringPtr *)&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[12],_nullptr>
            ((EqHelper *)local_90,"dst.Get()","\"Hello world\"",lhs,(char (*) [12])"Hello world");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arenastring_unittest.cc"
               ,0xb0,message);
    testing::internal::AssertHelper::operator=(&local_a0,&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  bVar1 = std::operator==((unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>
                           *)local_38,(nullptr_t)0x0);
  if (bVar1) {
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&gtest_ar.message_);
  }
  internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&default_value.inited_);
  std::unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>::
  ~unique_ptr((unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_> *)
              local_38);
  std::__cxx11::string::~string((string *)&arena);
  return;
}

Assistant:

TEST_P(SingleArena, CopyConstructValueWithDefault) {
  std::string empty;
  auto arena = GetArena();
  ArenaStringPtr field;
  field.InitExternal(&empty);
  field.Set("Hello world", nullptr);

  internal::LazyString default_value{{{"Hello default", 13}}, {nullptr}};
  ArenaStringPtr dst(arena.get(), field, default_value);
  EXPECT_EQ(dst.Get(), "Hello world");
  if (arena == nullptr) dst.Destroy();
  field.Destroy();
}